

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3423::CalcStrainANSbilinearShell(ChElementShellANCF_3423 *this)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  ChMatrixNM<double,_8,_24> *pCVar14;
  int j;
  long lVar15;
  int i;
  long lVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 in_ZMM20 [64];
  double adVar72 [8];
  ChMatrixNM<double,_1,_8> Nz;
  ChMatrixNM<double,_1,_3> tmpZ_1;
  ChMatrixNM<double,_1,_8> Ny;
  ChMatrixNM<double,_1,_8> Nx;
  LhsNested actual_lhs_1;
  LhsNested actual_lhs;
  ChMatrixNM<double,_1,_3> tmpZ;
  Matrix<double,_1,_8,_1,_1,_8> local_240;
  undefined8 *local_1e8;
  undefined1 local_1e0 [16];
  double local_1d0;
  Scalar local_1c8;
  double local_1c0 [8];
  double local_180 [12];
  ChMatrixNM<double,_8,_8> *local_120;
  ChMatrixNM<double,_8,_8> *local_118;
  long local_110;
  ChMatrixNM<double,_8,_24> *local_108;
  plain_array<double,_8,_0,_64> local_100;
  double local_c0;
  double dStack_b8;
  double dStack_b0;
  double dStack_a8;
  double dStack_a0;
  double dStack_98;
  double dStack_90;
  double dStack_88;
  
  auVar18 = in_ZMM20._0_16_;
  local_1e8 = (undefined8 *)::operator_new(0xc0);
  auVar18 = vxorps_avx512vl(auVar18,auVar18);
  adVar72 = (double  [8])ZEXT1664(auVar18);
  *(double (*) [8])(local_1e8 + 8) = adVar72;
  *(double (*) [8])(local_1e8 + 0x10) = adVar72;
  *local_1e8 = 0xbff0000000000000;
  local_1e8[1] = 0xbff0000000000000;
  local_1e8[2] = 0;
  local_1e8[3] = 0x3ff0000000000000;
  local_1e8[4] = 0xbff0000000000000;
  local_1e8[5] = 0;
  local_1e8[6] = 0xbff0000000000000;
  local_1e8[7] = 0x3ff0000000000000;
  local_1e8[8] = 0;
  local_1e8[9] = 0x3ff0000000000000;
  local_1e8[10] = 0x3ff0000000000000;
  local_1e8[0xb] = 0;
  local_1e8[0xc] = 0xbff0000000000000;
  local_1e8[0xd] = 0;
  local_1e8[0xe] = 0;
  local_1e8[0xf] = 0x3ff0000000000000;
  local_1e8[0x12] = 0;
  local_1e8[0x10] = 0;
  local_1e8[0x11] = 0;
  local_1e8[0x13] = 0xbff0000000000000;
  local_1e8[0x14] = 0;
  local_1e8[0x15] = 0;
  local_1e8[0x16] = 0x3ff0000000000000;
  local_1e8[0x17] = 0;
  local_118 = &this->m_ddT;
  local_120 = &this->m_d0d0T;
  pCVar14 = &this->m_strainANS_D;
  lVar16 = 0;
  do {
    auVar18 = adVar72._0_16_;
    local_180[7] = -2.0 / this->m_lenX;
    local_180[6] = local_180[7] * 0.25;
    local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[3]
         = 1.0 - (double)local_1e8[lVar16 * 3 + 1];
    local_180[0] = local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                   m_data.array[3] * local_180[6];
    local_1c0[5] = (double)local_1e8[lVar16 * 3 + 2] * this->m_thickness * 0.5 * 0.25;
    local_180[7] = local_180[7] * local_1c0[5];
    local_180[1] = local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                   m_data.array[3] * local_180[7];
    local_180[5] = 2.0 / this->m_lenX;
    local_180[4] = local_180[5] * 0.25;
    local_180[2] = local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                   m_data.array[3] * local_180[4];
    local_180[5] = local_180[5] * local_1c0[5];
    local_180[3] = local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                   m_data.array[3] * local_180[5];
    local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[7]
         = (double)local_1e8[lVar16 * 3 + 1] + 1.0;
    local_180[4] = local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                   m_data.array[7] * local_180[4];
    local_180[5] = local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                   m_data.array[7] * local_180[5];
    local_180[6] = local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                   m_data.array[7] * local_180[6];
    local_180[7] = local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                   m_data.array[7] * local_180[7];
    dVar7 = 1.0 - (double)local_1e8[lVar16 * 3];
    dVar6 = dVar7 * 0.25;
    local_1c0[3] = -2.0 / this->m_lenY;
    local_1c0[0] = dVar6 * local_1c0[3];
    dVar7 = local_1c0[5] * dVar7;
    local_1c0[1] = local_1c0[3] * dVar7;
    dVar5 = (double)local_1e8[lVar16 * 3] + 1.0;
    local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[5]
         = dVar5 * 0.25;
    local_1c0[2] = local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                   m_data.array[5] * local_1c0[3];
    local_1c0[5] = local_1c0[5] * dVar5;
    local_1c0[3] = local_1c0[3] * local_1c0[5];
    local_1c0[7] = 2.0 / this->m_lenY;
    local_1c0[4] = local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                   m_data.array[5] * local_1c0[7];
    local_1c0[5] = local_1c0[7] * local_1c0[5];
    local_1c0[6] = dVar6 * local_1c0[7];
    local_1c0[7] = local_1c0[7] * dVar7;
    local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[0]
         = 0.0;
    local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[1]
         = local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[3] * dVar6;
    local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[2]
         = 0.0;
    local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[3]
         = local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[5] *
           local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[3];
    local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[4]
         = 0.0;
    local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[5]
         = local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[5] *
           local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[7];
    local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[6]
         = 0.0;
    local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[7]
         = local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[7] * dVar6;
    local_1c8 = 1.0;
    local_110 = lVar16;
    local_108 = pCVar14;
    local_100.array = adVar72;
    local_1e0._0_8_ = &local_240;
    Eigen::internal::gemv_dense_selector<2,1,true>::
    run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
              (local_118,(Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)local_1e0,
               (Matrix<double,_8,_1,_0,_8,_1> *)&local_100,&local_1c8);
    local_c0 = local_100.array[0];
    dStack_b8 = local_100.array[1];
    dStack_b0 = local_100.array[2];
    dStack_a8 = local_100.array[3];
    dStack_a0 = local_100.array[4];
    dStack_98 = local_100.array[5];
    dStack_90 = local_100.array[6];
    dStack_88 = local_100.array[7];
    local_100.array._0_16_ = ZEXT816(0);
    local_100.array = (double  [8])ZEXT1664((undefined1  [16])local_100.array._0_16_);
    local_1c8 = 1.0;
    local_1e0._0_8_ = &local_240;
    Eigen::internal::gemv_dense_selector<2,1,true>::
    run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
              (local_120,(Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)local_1e0,
               (Matrix<double,_8,_1,_0,_8,_1> *)&local_100,&local_1c8);
    uVar17 = (uint)local_110;
    auVar18 = vxorps_avx512vl(auVar18,auVar18);
    adVar72 = (double  [8])ZEXT1664(auVar18);
    if (uVar17 < 8) {
      if ((0xfU >> (uVar17 & 0x1f) & 1) == 0) {
        if ((0x30U >> (uVar17 & 0x1f) & 1) == 0) {
          auVar27._8_8_ = local_180[1];
          auVar27._0_8_ = local_180[0];
          auVar27._16_8_ = local_180[2];
          auVar27._24_8_ = local_180[3];
          auVar27._32_8_ = local_180[4];
          auVar27._40_8_ = local_180[5];
          auVar27._48_8_ = local_180[6];
          auVar27._56_8_ = local_180[7];
          auVar28._8_8_ = dStack_b8;
          auVar28._0_8_ = local_c0;
          auVar28._16_8_ = dStack_b0;
          auVar28._24_8_ = dStack_a8;
          auVar28._32_8_ = dStack_a0;
          auVar28._40_8_ = dStack_98;
          auVar28._48_8_ = dStack_90;
          auVar28._56_8_ = dStack_88;
          auVar28 = vmulpd_avx512f(auVar27,auVar28);
          auVar25 = vextractf64x4_avx512f(auVar28,1);
          auVar27 = vmulpd_avx512f((undefined1  [64])local_100.array,auVar27);
          auVar26 = vextractf64x4_avx512f(auVar27,1);
          (this->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
          .m_data.array[local_110] =
               (auVar28._0_8_ + auVar25._0_8_ + auVar28._8_8_ + auVar25._8_8_ +
               auVar28._16_8_ + auVar25._16_8_ + auVar28._24_8_ + auVar25._24_8_) -
               (auVar27._0_8_ + auVar26._0_8_ + auVar27._8_8_ + auVar26._8_8_ +
               auVar27._16_8_ + auVar26._16_8_ + auVar27._24_8_ + auVar26._24_8_);
          dVar8 = (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                  .m_data.array[0];
          dVar9 = (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                  .m_data.array[1];
          auVar23._0_8_ = dVar8 * local_180[0];
          auVar23._8_8_ = dVar9 * local_180[0];
          auVar20._8_8_ = local_180[1];
          auVar20._0_8_ = local_180[1];
          auVar18 = *(undefined1 (*) [16])
                     ((this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                      m_storage.m_data.array + 3);
          auVar24 = vfmadd231pd_fma(auVar23,auVar20,auVar18);
          auVar42._8_8_ = local_180[2];
          auVar42._0_8_ = local_180[2];
          auVar23 = *(undefined1 (*) [16])
                     ((this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                      m_storage.m_data.array + 6);
          auVar42 = vfmadd231pd_fma(auVar24,auVar42,auVar23);
          auVar48._8_8_ = local_180[3];
          auVar48._0_8_ = local_180[3];
          auVar24 = *(undefined1 (*) [16])
                     ((this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                      m_storage.m_data.array + 9);
          auVar59 = vfmadd231pd_fma(auVar42,auVar48,auVar24);
          auVar53._8_8_ = local_180[4];
          auVar53._0_8_ = local_180[4];
          auVar42 = *(undefined1 (*) [16])
                     ((this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                      m_storage.m_data.array + 0xc);
          auVar53 = vfmadd231pd_fma(auVar59,auVar53,auVar42);
          auVar57._8_8_ = local_180[5];
          auVar57._0_8_ = local_180[5];
          auVar59 = *(undefined1 (*) [16])
                     ((this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                      m_storage.m_data.array + 0xf);
          auVar57 = vfmadd231pd_fma(auVar53,auVar57,auVar59);
          auVar62._8_8_ = local_180[6];
          auVar62._0_8_ = local_180[6];
          auVar53 = *(undefined1 (*) [16])
                     ((this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                      m_storage.m_data.array + 0x12);
          auVar19 = vfmadd231pd_fma(auVar57,auVar62,auVar53);
          auVar65._8_8_ = local_180[7];
          auVar65._0_8_ = local_180[7];
          auVar57 = *(undefined1 (*) [16])
                     ((this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                      m_storage.m_data.array + 0x15);
          auVar19 = vfmadd231pd_avx512vl(auVar19,auVar65,auVar57);
          dVar5 = (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                  .m_data.array[2];
          auVar67._8_8_ = 0;
          auVar67._0_8_ =
               (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
               m_data.array[5];
          auVar20 = vmulsd_avx512f(auVar20,auVar67);
          dVar6 = (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                  .m_data.array[8];
          auVar69._8_8_ = 0;
          auVar69._0_8_ =
               (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
               m_data.array[0xb];
          auVar21 = vmulsd_avx512f(auVar48,auVar69);
          dVar7 = (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                  .m_data.array[0xe];
          dVar1 = (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                  .m_data.array[0x11];
          dVar2 = (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                  .m_data.array[0x14];
          auVar71._8_8_ = 0;
          auVar71._0_8_ =
               (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
               m_data.array[0x17];
          auVar22 = vmulsd_avx512f(auVar65,auVar71);
          local_100.array[2] =
               local_180[0] * dVar5 + auVar20._0_8_ + local_180[2] * dVar6 + auVar21._0_8_ +
               local_180[6] * dVar2 + auVar22._0_8_ + local_180[5] * dVar1 + local_180[4] * dVar7;
          local_100.array[0] = (double)auVar19._0_8_;
          local_100.array[1] = (double)auVar19._8_8_;
          auVar19._0_8_ =
               dVar8 * local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                       m_storage.m_data.array[0];
          auVar19._8_8_ =
               dVar9 * local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                       m_storage.m_data.array[0];
          auVar49._8_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[1];
          auVar49._0_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[1];
          auVar18 = vfmadd231pd_fma(auVar19,auVar49,auVar18);
          auVar21._8_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[2];
          auVar21._0_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[2];
          auVar18 = vfmadd231pd_fma(auVar18,auVar21,auVar23);
          auVar22._8_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[3];
          auVar22._0_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[3];
          auVar18 = vfmadd231pd_fma(auVar18,auVar22,auVar24);
          auVar24._8_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[4];
          auVar24._0_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[4];
          auVar18 = vfmadd231pd_fma(auVar18,auVar24,auVar42);
          auVar55._8_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[5];
          auVar55._0_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[5];
          auVar18 = vfmadd231pd_fma(auVar18,auVar55,auVar59);
          auVar59._8_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[6];
          auVar59._0_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[6];
          auVar18 = vfmadd231pd_fma(auVar18,auVar59,auVar53);
          auVar63._8_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[7];
          auVar63._0_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[7];
          local_1e0 = vfmadd231pd_avx512vl(auVar18,auVar63,auVar57);
          auVar18 = vmulsd_avx512f(auVar67,auVar49);
          auVar23 = vmulsd_avx512f(auVar69,auVar22);
          auVar24 = vmulsd_avx512f(auVar71,auVar63);
          local_1d0 = dVar5 * local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>
                              .m_storage.m_data.array[0] + auVar18._0_8_ +
                      dVar6 * local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>
                              .m_storage.m_data.array[2] + auVar23._0_8_ +
                      local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                      m_storage.m_data.array[4] * dVar7 +
                      dVar1 * local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>
                              .m_storage.m_data.array[5] +
                      dVar2 * local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>
                              .m_storage.m_data.array[6] + auVar24._0_8_;
          lVar16 = 0;
          pCVar14 = local_108;
          do {
            auVar18._8_8_ = 0;
            auVar18._0_8_ =
                 local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                 m_data.array[lVar16];
            dVar5 = local_180[lVar16];
            lVar15 = 0;
            do {
              auVar4._8_8_ = 0;
              auVar4._0_8_ = local_100.array[lVar15];
              auVar35._8_8_ = 0;
              auVar35._0_8_ = dVar5 * *(double *)(local_1e0 + lVar15 * 8);
              auVar23 = vfmadd231sd_fma(auVar35,auVar18,auVar4);
              (pCVar14->super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>).m_storage.
              m_data.array[lVar15] = auVar23._0_8_;
              lVar15 = lVar15 + 1;
            } while (lVar15 != 3);
            lVar16 = lVar16 + 1;
            pCVar14 = (ChMatrixNM<double,_8,_24> *)
                      ((pCVar14->super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>).
                       m_storage.m_data.array + 3);
          } while (lVar16 != 8);
        }
        else {
          auVar11._8_8_ = local_1c0[1];
          auVar11._0_8_ = local_1c0[0];
          auVar11._16_8_ = local_1c0[2];
          auVar11._24_8_ = local_1c0[3];
          auVar11._32_8_ = local_1c0[4];
          auVar11._40_8_ = local_1c0[5];
          auVar11._48_8_ = local_1c0[6];
          auVar11._56_8_ = local_1c0[7];
          auVar13._8_8_ = dStack_b8;
          auVar13._0_8_ = local_c0;
          auVar13._16_8_ = dStack_b0;
          auVar13._24_8_ = dStack_a8;
          auVar13._32_8_ = dStack_a0;
          auVar13._40_8_ = dStack_98;
          auVar13._48_8_ = dStack_90;
          auVar13._56_8_ = dStack_88;
          auVar27 = vmulpd_avx512f(auVar11,auVar13);
          auVar25 = vextractf64x4_avx512f(auVar27,1);
          auVar28 = vmulpd_avx512f((undefined1  [64])local_100.array,auVar11);
          auVar26 = vextractf64x4_avx512f(auVar28,1);
          (this->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
          .m_data.array[local_110] =
               (auVar27._0_8_ + auVar25._0_8_ + auVar27._8_8_ + auVar25._8_8_ +
               auVar27._16_8_ + auVar25._16_8_ + auVar27._24_8_ + auVar25._24_8_) -
               (auVar28._0_8_ + auVar26._0_8_ + auVar28._8_8_ + auVar26._8_8_ +
               auVar28._16_8_ + auVar26._16_8_ + auVar28._24_8_ + auVar26._24_8_);
          dVar8 = (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                  .m_data.array[0];
          dVar9 = (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                  .m_data.array[1];
          auVar33._0_8_ = dVar8 * local_1c0[0];
          auVar33._8_8_ = dVar9 * local_1c0[0];
          auVar37._8_8_ = local_1c0[1];
          auVar37._0_8_ = local_1c0[1];
          auVar18 = *(undefined1 (*) [16])
                     ((this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                      m_storage.m_data.array + 3);
          auVar24 = vfmadd231pd_fma(auVar33,auVar37,auVar18);
          auVar41._8_8_ = local_1c0[2];
          auVar41._0_8_ = local_1c0[2];
          auVar23 = *(undefined1 (*) [16])
                     ((this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                      m_storage.m_data.array + 6);
          auVar42 = vfmadd231pd_fma(auVar24,auVar41,auVar23);
          auVar46._8_8_ = local_1c0[3];
          auVar46._0_8_ = local_1c0[3];
          auVar24 = *(undefined1 (*) [16])
                     ((this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                      m_storage.m_data.array + 9);
          auVar59 = vfmadd231pd_fma(auVar42,auVar46,auVar24);
          auVar52._8_8_ = local_1c0[4];
          auVar52._0_8_ = local_1c0[4];
          auVar42 = *(undefined1 (*) [16])
                     ((this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                      m_storage.m_data.array + 0xc);
          auVar53 = vfmadd231pd_fma(auVar59,auVar52,auVar42);
          auVar56._8_8_ = local_1c0[5];
          auVar56._0_8_ = local_1c0[5];
          auVar59 = *(undefined1 (*) [16])
                     ((this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                      m_storage.m_data.array + 0xf);
          auVar57 = vfmadd231pd_fma(auVar53,auVar56,auVar59);
          auVar60._8_8_ = local_1c0[6];
          auVar60._0_8_ = local_1c0[6];
          auVar53 = *(undefined1 (*) [16])
                     ((this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                      m_storage.m_data.array + 0x12);
          auVar19 = vfmadd231pd_fma(auVar57,auVar60,auVar53);
          auVar64._8_8_ = local_1c0[7];
          auVar64._0_8_ = local_1c0[7];
          auVar57 = *(undefined1 (*) [16])
                     ((this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                      m_storage.m_data.array + 0x15);
          auVar19 = vfmadd231pd_avx512vl(auVar19,auVar64,auVar57);
          dVar5 = (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                  .m_data.array[2];
          auVar66._8_8_ = 0;
          auVar66._0_8_ =
               (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
               m_data.array[5];
          auVar20 = vmulsd_avx512f(auVar37,auVar66);
          dVar6 = (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                  .m_data.array[8];
          auVar68._8_8_ = 0;
          auVar68._0_8_ =
               (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
               m_data.array[0xb];
          auVar21 = vmulsd_avx512f(auVar46,auVar68);
          dVar7 = (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                  .m_data.array[0xe];
          dVar1 = (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                  .m_data.array[0x11];
          dVar2 = (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                  .m_data.array[0x14];
          auVar70._8_8_ = 0;
          auVar70._0_8_ =
               (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
               m_data.array[0x17];
          auVar22 = vmulsd_avx512f(auVar64,auVar70);
          local_100.array[2] =
               local_1c0[0] * dVar5 + auVar20._0_8_ + local_1c0[2] * dVar6 + auVar21._0_8_ +
               local_1c0[6] * dVar2 + auVar22._0_8_ + local_1c0[5] * dVar1 + local_1c0[4] * dVar7;
          local_100.array[0] = (double)auVar19._0_8_;
          local_100.array[1] = (double)auVar19._8_8_;
          auVar31._0_8_ =
               dVar8 * local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                       m_storage.m_data.array[0];
          auVar31._8_8_ =
               dVar9 * local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                       m_storage.m_data.array[0];
          auVar47._8_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[1];
          auVar47._0_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[1];
          auVar18 = vfmadd231pd_fma(auVar31,auVar47,auVar18);
          auVar39._8_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[2];
          auVar39._0_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[2];
          auVar18 = vfmadd231pd_fma(auVar18,auVar39,auVar23);
          auVar44._8_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[3];
          auVar44._0_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[3];
          auVar18 = vfmadd231pd_fma(auVar18,auVar44,auVar24);
          auVar51._8_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[4];
          auVar51._0_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[4];
          auVar18 = vfmadd231pd_fma(auVar18,auVar51,auVar42);
          auVar54._8_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[5];
          auVar54._0_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[5];
          auVar18 = vfmadd231pd_fma(auVar18,auVar54,auVar59);
          auVar58._8_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[6];
          auVar58._0_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[6];
          auVar18 = vfmadd231pd_fma(auVar18,auVar58,auVar53);
          auVar61._8_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[7];
          auVar61._0_8_ =
               local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[7];
          local_1e0 = vfmadd231pd_avx512vl(auVar18,auVar61,auVar57);
          auVar18 = vmulsd_avx512f(auVar66,auVar47);
          auVar23 = vmulsd_avx512f(auVar68,auVar44);
          auVar24 = vmulsd_avx512f(auVar70,auVar61);
          local_1d0 = dVar5 * local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>
                              .m_storage.m_data.array[0] + auVar18._0_8_ +
                      dVar6 * local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>
                              .m_storage.m_data.array[2] + auVar23._0_8_ +
                      local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                      m_storage.m_data.array[4] * dVar7 +
                      dVar1 * local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>
                              .m_storage.m_data.array[5] +
                      dVar2 * local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>
                              .m_storage.m_data.array[6] + auVar24._0_8_;
          lVar16 = 0;
          pCVar14 = local_108;
          do {
            auVar29._8_8_ = 0;
            auVar29._0_8_ =
                 local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                 m_data.array[lVar16];
            dVar5 = local_1c0[lVar16];
            lVar15 = 0;
            do {
              auVar3._8_8_ = 0;
              auVar3._0_8_ = local_100.array[lVar15];
              auVar34._8_8_ = 0;
              auVar34._0_8_ = dVar5 * *(double *)(local_1e0 + lVar15 * 8);
              auVar18 = vfmadd231sd_fma(auVar34,auVar29,auVar3);
              (pCVar14->super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>).m_storage.
              m_data.array[lVar15] = auVar18._0_8_;
              lVar15 = lVar15 + 1;
            } while (lVar15 != 3);
            lVar16 = lVar16 + 1;
            pCVar14 = (ChMatrixNM<double,_8,_24> *)
                      ((pCVar14->super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>).
                       m_storage.m_data.array + 3);
          } while (lVar16 != 8);
        }
      }
      else {
        auVar10._8_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[1];
        auVar10._0_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[0];
        auVar10._16_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[2];
        auVar10._24_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[3];
        auVar10._32_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[4];
        auVar10._40_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[5];
        auVar10._48_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[6];
        auVar10._56_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[7];
        auVar12._8_8_ = dStack_b8;
        auVar12._0_8_ = local_c0;
        auVar12._16_8_ = dStack_b0;
        auVar12._24_8_ = dStack_a8;
        auVar12._32_8_ = dStack_a0;
        auVar12._40_8_ = dStack_98;
        auVar12._48_8_ = dStack_90;
        auVar12._56_8_ = dStack_88;
        auVar27 = vmulpd_avx512f(auVar10,auVar12);
        auVar25 = vextractf64x4_avx512f(auVar27,1);
        auVar28 = vmulpd_avx512f((undefined1  [64])local_100.array,auVar10);
        auVar26 = vextractf64x4_avx512f(auVar28,1);
        (this->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
        m_data.array[local_110] =
             ((auVar27._0_8_ + auVar25._0_8_ + auVar27._8_8_ + auVar25._8_8_ +
              auVar27._16_8_ + auVar25._16_8_ + auVar27._24_8_ + auVar25._24_8_) -
             (auVar28._0_8_ + auVar26._0_8_ + auVar28._8_8_ + auVar26._8_8_ +
             auVar28._16_8_ + auVar26._16_8_ + auVar28._24_8_ + auVar26._24_8_)) * 0.5;
        auVar30._0_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[0] *
             (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
             m_data.array[0];
        auVar30._8_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[0] *
             (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
             m_data.array[1];
        auVar32._8_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[1];
        auVar32._0_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[1];
        auVar18 = vfmadd231pd_fma(auVar30,auVar32,
                                  *(undefined1 (*) [16])
                                   ((this->m_d).
                                    super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                                    m_storage.m_data.array + 3));
        auVar36._8_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[2];
        auVar36._0_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[2];
        auVar18 = vfmadd231pd_fma(auVar18,auVar36,
                                  *(undefined1 (*) [16])
                                   ((this->m_d).
                                    super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                                    m_storage.m_data.array + 6));
        auVar38._8_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[3];
        auVar38._0_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[3];
        auVar18 = vfmadd231pd_fma(auVar18,auVar38,
                                  *(undefined1 (*) [16])
                                   ((this->m_d).
                                    super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                                    m_storage.m_data.array + 9));
        auVar40._8_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[4];
        auVar40._0_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[4];
        auVar18 = vfmadd231pd_fma(auVar18,auVar40,
                                  *(undefined1 (*) [16])
                                   ((this->m_d).
                                    super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                                    m_storage.m_data.array + 0xc));
        auVar43._8_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[5];
        auVar43._0_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[5];
        auVar18 = vfmadd231pd_fma(auVar18,auVar43,
                                  *(undefined1 (*) [16])
                                   ((this->m_d).
                                    super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                                    m_storage.m_data.array + 0xf));
        auVar45._8_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[6];
        auVar45._0_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[6];
        auVar18 = vfmadd231pd_fma(auVar18,auVar45,
                                  *(undefined1 (*) [16])
                                   ((this->m_d).
                                    super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                                    m_storage.m_data.array + 0x12));
        auVar50._8_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[7];
        auVar50._0_8_ =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[7];
        auVar18 = vfmadd231pd_fma(auVar18,auVar50,
                                  *(undefined1 (*) [16])
                                   ((this->m_d).
                                    super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                                    m_storage.m_data.array + 0x15));
        local_100.array[2] =
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[0] *
             (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
             m_data.array[2] +
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[1] *
             (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
             m_data.array[5] +
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[2] *
             (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
             m_data.array[8] +
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[3] *
             (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
             m_data.array[0xb] +
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[4] *
             (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
             m_data.array[0xe] +
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[5] *
             (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
             m_data.array[0x11] +
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[6] *
             (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
             m_data.array[0x14] +
             local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[7] *
             (this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
             m_data.array[0x17];
        local_100.array[0] = (double)auVar18._0_8_;
        local_100.array[1] = (double)auVar18._8_8_;
        lVar16 = 0;
        pCVar14 = local_108;
        do {
          dVar5 = local_240.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                  m_data.array[lVar16];
          lVar15 = 0;
          do {
            (pCVar14->super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>).m_storage.
            m_data.array[lVar15] = dVar5 * local_100.array[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          lVar16 = lVar16 + 1;
          pCVar14 = (ChMatrixNM<double,_8,_24> *)
                    ((pCVar14->super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>).
                     m_storage.m_data.array + 3);
        } while (lVar16 != 8);
      }
    }
    lVar16 = local_110 + 1;
    pCVar14 = (ChMatrixNM<double,_8,_24> *)
              ((local_108->super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>).m_storage
               .m_data.array + 0x18);
  } while (lVar16 != 8);
  operator_delete(local_1e8,0xc0);
  return;
}

Assistant:

void ChElementShellANCF_3423::CalcStrainANSbilinearShell() {
    std::vector<ChVector<>> knots(8);

    knots[0] = ChVector<>(-1, -1, 0);
    knots[1] = ChVector<>(1, -1, 0);
    knots[2] = ChVector<>(-1, 1, 0);
    knots[3] = ChVector<>(1, 1, 0);
    knots[4] = ChVector<>(-1, 0, 0);  // A
    knots[5] = ChVector<>(1, 0, 0);   // B
    knots[6] = ChVector<>(0, -1, 0);  // C
    knots[7] = ChVector<>(0, 1, 0);   // D

    ChMatrixNM<double, 1, 8> Nx;
    ChMatrixNM<double, 1, 8> Ny;
    ChMatrixNM<double, 1, 8> Nz;
    ChVectorN<double, 8> ddNz;
    ChVectorN<double, 8> d0d0Nz;

    for (int kk = 0; kk < 8; kk++) {
        ShapeFunctionsDerivativeX(Nx, knots[kk].x(), knots[kk].y(), knots[kk].z());
        ShapeFunctionsDerivativeY(Ny, knots[kk].x(), knots[kk].y(), knots[kk].z());
        ShapeFunctionsDerivativeZ(Nz, knots[kk].x(), knots[kk].y(), knots[kk].z());

        ddNz = m_ddT * Nz.transpose();
        d0d0Nz = m_d0d0T * Nz.transpose();

        switch (kk) {
            case 0:
            case 1:
            case 2:
            case 3: {
                m_strainANS(kk) = 0.5 * ((Nz * ddNz)(0, 0) - (Nz * d0d0Nz)(0, 0));
                ChMatrixNM<double, 1, 3> tmpZ = Nz * m_d;
                for (int i = 0; i < 8; i++)
                    for (int j = 0; j < 3; j++)
                        m_strainANS_D(kk, i * 3 + j) = tmpZ(0, j) * Nz(0, i);
                break;
            }
            case 4:
            case 5: {  // => yz
                m_strainANS(kk) = (Ny * ddNz)(0, 0) - (Ny * d0d0Nz)(0, 0);
                ChMatrixNM<double, 1, 3> tmpY = Ny * m_d;
                ChMatrixNM<double, 1, 3> tmpZ = Nz * m_d;
                for (int i = 0; i < 8; i++)
                    for (int j = 0; j < 3; j++)
                        m_strainANS_D(kk, i * 3 + j) = tmpY(0, j) * Nz(0, i) + tmpZ(0, j) * Ny(0, i);
                break;
            }
            case 6:
            case 7: {  // => xz
                m_strainANS(kk) = (Nx * ddNz)(0, 0) - (Nx * d0d0Nz)(0, 0);
                ChMatrixNM<double, 1, 3> tmpX = Nx * m_d;
                ChMatrixNM<double, 1, 3> tmpZ = Nz * m_d;
                for (int i = 0; i < 8; i++)
                    for (int j = 0; j < 3; j++)
                        m_strainANS_D(kk, i * 3 + j) = tmpX(0, j) * Nz(0, i) + tmpZ(0, j) * Nx(0, i);
                break;
            }
        }
    }
}